

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

int xmlTextReaderEntPush(xmlTextReaderPtr reader,xmlNodePtr value)

{
  int iVar1;
  xmlNodePtr *ppxVar2;
  uint uVar3;
  uint uVar4;
  
  iVar1 = reader->entMax;
  if (iVar1 <= reader->entNr) {
    if (iVar1 < 1) {
      uVar4 = 10;
    }
    else {
      uVar4 = 0xffffffff;
      if (iVar1 < 1000000000) {
        uVar3 = iVar1 + 1U >> 1;
        uVar4 = uVar3 + iVar1;
        if ((int)(1000000000 - uVar3) < iVar1) {
          uVar4 = 1000000000;
        }
      }
    }
    if (((int)uVar4 < 0) ||
       (ppxVar2 = (xmlNodePtr *)(*xmlRealloc)(reader->entTab,(ulong)uVar4 << 3),
       ppxVar2 == (xmlNodePtr *)0x0)) {
      xmlTextReaderErrMemory(reader);
      return -1;
    }
    reader->entTab = ppxVar2;
    reader->entMax = uVar4;
  }
  iVar1 = reader->entNr;
  reader->entTab[iVar1] = value;
  reader->ent = value;
  reader->entNr = iVar1 + 1;
  return iVar1;
}

Assistant:

static int
xmlTextReaderEntPush(xmlTextReaderPtr reader, xmlNodePtr value)
{
    if (reader->entNr >= reader->entMax) {
        xmlNodePtr *tmp;
        int newSize;

        newSize = xmlGrowCapacity(reader->entMax, sizeof(tmp[0]),
                                  10, XML_MAX_ITEMS);
        if (newSize < 0) {
            xmlTextReaderErrMemory(reader);
            return (-1);
        }
        tmp = xmlRealloc(reader->entTab, newSize * sizeof(tmp[0]));
        if (tmp == NULL) {
            xmlTextReaderErrMemory(reader);
            return (-1);
        }
        reader->entTab = tmp;
        reader->entMax = newSize;
    }
    reader->entTab[reader->entNr] = value;
    reader->ent = value;
    return (reader->entNr++);
}